

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
          *this,demand_t *dest,select_case_t *select_case)

{
  extraction_status_t eVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->m_lock;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  if ((this->m_queue).m_size == 0) {
    eVar1 = chain_closed;
    if (this->m_status != closed) {
      eVar1 = no_messages;
      *(select_case_t **)(select_case + 0x18) = this->m_select_tail;
      this->m_select_tail = select_case;
    }
  }
  else {
    eVar1 = extract_demand_from_not_empty_queue(this,dest);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return eVar1;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			select_case_t & select_case ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				const bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// There is no need to wait for something.
							return extraction_status_t::chain_closed;

						// In other cases select_tail must be modified.
						select_case.set_next( m_select_tail );
						m_select_tail = &select_case;

						return extraction_status_t::no_messages;
					}
				else
					return extract_demand_from_not_empty_queue( dest );
			}